

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_vacuum.cpp
# Opt level: O3

void __thiscall
duckdb::VacuumGlobalSinkState::VacuumGlobalSinkState
          (VacuumGlobalSinkState *this,VacuumInfo *info,
          optional_ptr<duckdb::TableCatalogEntry,_true> table)

{
  pointer pbVar1;
  undefined8 uVar2;
  bool bVar3;
  ColumnDefinition *this_00;
  _Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
  this_01;
  pointer name;
  LogicalType local_58;
  VacuumGlobalSinkState *local_40;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_38;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__VacuumGlobalSinkState_02461338;
  (this->stats_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->stats_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->stats_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->stats_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->stats_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->column_distinct_stats).
  super_vector<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_distinct_stats).
  super_vector<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_distinct_stats).
  super_vector<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name = (info->columns).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (info->columns).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (name != pbVar1) {
    local_40 = this;
    local_38.ptr = table.ptr;
    do {
      optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&local_38);
      this_00 = TableCatalogEntry::GetColumn(local_38.ptr,name);
      ColumnDefinition::GetType(&local_58,this_00);
      bVar3 = DistinctStatistics::TypeIsSupported(&local_58);
      LogicalType::~LogicalType(&local_58);
      if (bVar3) {
        this_01.super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl =
             (_Head_base<0UL,_duckdb::DistinctStatistics_*,_false>)operator_new(0x18);
        DistinctStatistics::DistinctStatistics
                  ((DistinctStatistics *)
                   this_01.super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl);
        local_58._0_8_ =
             this_01.super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl;
        ::std::
        vector<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>>
                    *)&this->column_distinct_stats,
                   (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
                    *)&local_58);
      }
      else {
        local_58._0_8_ = (DistinctStatistics *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>>
                    *)&this->column_distinct_stats,
                   (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
                    *)&local_58);
      }
      uVar2 = local_58._0_8_;
      if ((_Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
           )local_58._0_8_ != (DistinctStatistics *)0x0) {
        if ((tuple<duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>)
            *(__uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_> *)
             local_58._0_8_ !=
            (_Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>)0x0)
        {
          operator_delete((void *)*(__uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>
                                    *)local_58._0_8_);
        }
        operator_delete((void *)uVar2);
      }
      name = name + 1;
    } while (name != pbVar1);
  }
  return;
}

Assistant:

explicit VacuumGlobalSinkState(VacuumInfo &info, optional_ptr<TableCatalogEntry> table) {
		for (const auto &column_name : info.columns) {
			auto &column = table->GetColumn(column_name);
			if (DistinctStatistics::TypeIsSupported(column.GetType())) {
				column_distinct_stats.push_back(make_uniq<DistinctStatistics>());
			} else {
				column_distinct_stats.push_back(nullptr);
			}
		}
	}